

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O3

int reduce_f5_up(vrna_fold_compound_t *fc,int j,vrna_callback_hc_evaluate *evaluate,
                default_data *hc_dat_local,sc_wrapper_f5 *sc_wrapper)

{
  ulong uVar1;
  vrna_ud_t *pvVar2;
  int *piVar3;
  code *pcVar4;
  uchar uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  
  pvVar2 = fc->domains_up;
  piVar3 = (fc->matrices->field_2).field_0.f5;
  pcVar4 = (code *)sc_wrapper->red_ext;
  iVar10 = 10000000;
  if (piVar3[(long)j + -1] != 10000000) {
    uVar1 = (long)j - 1;
    uVar5 = (*evaluate)(1,j,1,(int)uVar1,'\f',hc_dat_local);
    if (uVar5 != '\0') {
      iVar10 = piVar3[uVar1];
      if (pcVar4 != (code *)0x0) {
        iVar6 = (*pcVar4)(j,1,uVar1 & 0xffffffff,sc_wrapper);
        iVar10 = iVar10 + iVar6;
      }
    }
  }
  if (((pvVar2 != (vrna_ud_t *)0x0) && (pvVar2->energy_cb != (vrna_callback_ud_energy *)0x0)) &&
     (0 < pvVar2->uniq_motif_count)) {
    lVar9 = 0;
    do {
      uVar8 = j - pvVar2->uniq_motif_size[lVar9];
      if ((-1 < (int)uVar8) && (piVar3[uVar8] != 10000000)) {
        uVar5 = (*evaluate)(1,j,1,uVar8,'\f',hc_dat_local);
        if (uVar5 != '\0') {
          iVar6 = piVar3[uVar8];
          iVar7 = (*pvVar2->energy_cb)(fc,uVar8 + 1,j,0x11,pvVar2->data);
          iVar7 = iVar7 + iVar6;
          if (pcVar4 != (code *)0x0) {
            iVar6 = (*pcVar4)(j,1,uVar8,sc_wrapper);
            iVar7 = iVar7 + iVar6;
          }
          if (iVar7 <= iVar10) {
            iVar10 = iVar7;
          }
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < pvVar2->uniq_motif_count);
  }
  return iVar10;
}

Assistant:

int
reduce_f5_up(vrna_fold_compound_t       *fc,
             int                        j,
             vrna_callback_hc_evaluate  *evaluate,
             struct default_data        *hc_dat_local,
             struct sc_wrapper_f5       *sc_wrapper)
{
  int                 u, k, e, en, *f5;
  vrna_ud_t           *domains_up;
  sc_f5_reduce_to_ext *sc_red_ext;

  f5          = fc->matrices->f5;
  domains_up  = fc->domains_up;
  e           = INF;

  sc_red_ext = sc_wrapper->red_ext;

  /* check for 3' extension with one unpaired nucleotide */
  if (f5[j - 1] != INF) {
    if (evaluate(1, j, 1, j - 1, VRNA_DECOMP_EXT_EXT, hc_dat_local)) {
      e = f5[j - 1];

      if (sc_red_ext)
        e += sc_red_ext(j, 1, j - 1, sc_wrapper);
    }
  }

  if ((domains_up) && (domains_up->energy_cb)) {
    for (k = 0; k < domains_up->uniq_motif_count; k++) {
      u = domains_up->uniq_motif_size[k];
      if ((j - u >= 0) && (f5[j - u] != INF)) {
        if (evaluate(1, j, 1, j - u, VRNA_DECOMP_EXT_EXT, hc_dat_local)) {
          en = f5[j - u] +
               domains_up->energy_cb(fc,
                                     j - u + 1,
                                     j,
                                     VRNA_UNSTRUCTURED_DOMAIN_EXT_LOOP | VRNA_UNSTRUCTURED_DOMAIN_MOTIF,
                                     domains_up->data);

          if (sc_red_ext)
            en += sc_red_ext(j, 1, j - u, sc_wrapper);

          e = MIN2(e, en);
        }
      }
    }
  }

  return e;
}